

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O0

void ZSTD_updateDUBT(ZSTD_matchState_t *ms,ZSTD_compressionParameters *cParams,BYTE *ip,BYTE *iend,
                    U32 mls)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  size_t sVar5;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  U32 *sortMarkPtr;
  U32 *nextCandidatePtr;
  U32 matchIndex;
  size_t h;
  U32 idx;
  U32 target;
  BYTE *base;
  U32 btMask;
  U32 btLog;
  U32 *bt;
  U32 hashLog;
  U32 *hashTable;
  undefined4 *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  uint local_58;
  
  lVar2 = *(long *)(in_RDI + 0x30);
  lVar3 = *(long *)(in_RDI + 0x40);
  uVar1 = *(undefined4 *)(in_RSI + 4);
  uVar4 = in_EDX - (int)*(undefined8 *)(in_RDI + 8);
  for (local_58 = *(uint *)(in_RDI + 0x24); local_58 < uVar4; local_58 = local_58 + 1) {
    sVar5 = ZSTD_hashPtr((void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         (U32)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                         (U32)in_stack_ffffffffffffff90);
    in_stack_ffffffffffffff9c = *(undefined4 *)(lVar2 + sVar5 * 4);
    in_stack_ffffffffffffff90 =
         (undefined4 *)
         (lVar3 + (ulong)((local_58 & (1 << ((char)uVar1 - 1U & 0x1f)) - 1U) << 1) * 4);
    *(uint *)(lVar2 + sVar5 * 4) = local_58;
    *in_stack_ffffffffffffff90 = in_stack_ffffffffffffff9c;
    in_stack_ffffffffffffff90[1] = 1;
  }
  *(uint *)(in_RDI + 0x24) = uVar4;
  return;
}

Assistant:

void ZSTD_updateDUBT(
                ZSTD_matchState_t* ms, ZSTD_compressionParameters const* cParams,
                const BYTE* ip, const BYTE* iend,
                U32 mls)
{
    U32* const hashTable = ms->hashTable;
    U32  const hashLog = cParams->hashLog;

    U32* const bt = ms->chainTable;
    U32  const btLog  = cParams->chainLog - 1;
    U32  const btMask = (1 << btLog) - 1;

    const BYTE* const base = ms->window.base;
    U32 const target = (U32)(ip - base);
    U32 idx = ms->nextToUpdate;

    if (idx != target)
        DEBUGLOG(7, "ZSTD_updateDUBT, from %u to %u (dictLimit:%u)",
                    idx, target, ms->window.dictLimit);
    assert(ip + 8 <= iend);   /* condition for ZSTD_hashPtr */
    (void)iend;

    assert(idx >= ms->window.dictLimit);   /* condition for valid base+idx */
    for ( ; idx < target ; idx++) {
        size_t const h  = ZSTD_hashPtr(base + idx, hashLog, mls);   /* assumption : ip + 8 <= iend */
        U32    const matchIndex = hashTable[h];

        U32*   const nextCandidatePtr = bt + 2*(idx&btMask);
        U32*   const sortMarkPtr  = nextCandidatePtr + 1;

        DEBUGLOG(8, "ZSTD_updateDUBT: insert %u", idx);
        hashTable[h] = idx;   /* Update Hash Table */
        *nextCandidatePtr = matchIndex;   /* update BT like a chain */
        *sortMarkPtr = ZSTD_DUBT_UNSORTED_MARK;
    }
    ms->nextToUpdate = target;
}